

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>_>
      *this,Module *module)

{
  __node_base_ptr wasm;
  uint uVar1;
  PassRunner *pPVar2;
  PassOptions *pPVar3;
  int *piVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_298 [3];
  PassOptions local_280;
  undefined1 local_1c8 [8];
  PassRunner runner;
  undefined1 local_d0 [8];
  PassOptions options;
  Module *module_local;
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>_>
  *this_local;
  
  options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)module;
  pPVar2 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar2 != (PassRunner *)0x0) {
    uVar1 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((uVar1 & 1) == 0) {
      Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
      ::walkModule(&(this->
                    super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
                    ).
                    super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
                   ,(Module *)options.passesToSkip._M_h._M_single_bucket);
    }
    else {
      pPVar3 = Pass::getPassOptions(&this->super_Pass);
      PassOptions::PassOptions((PassOptions *)local_d0,pPVar3);
      runner._236_4_ = 1;
      piVar4 = std::min<int>((int *)(local_d0 + 4),(int *)&runner.field_0xec);
      local_d0._4_4_ = *piVar4;
      runner.isNested = true;
      runner.addedPassesRemovedDWARF = false;
      runner._234_2_ = 0;
      piVar4 = std::min<int>((int *)&options,(int *)&runner.isNested);
      wasm = options.passesToSkip._M_h._M_single_bucket;
      options._0_4_ = *piVar4;
      PassOptions::PassOptions(&local_280,(PassOptions *)local_d0);
      PassRunner::PassRunner((PassRunner *)local_1c8,(Module *)wasm,&local_280);
      PassOptions::~PassOptions(&local_280);
      PassRunner::setIsNested((PassRunner *)local_1c8,true);
      (*(this->super_Pass)._vptr_Pass[5])(local_298);
      PassRunner::add((PassRunner *)local_1c8,local_298);
      std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(local_298);
      PassRunner::run((PassRunner *)local_1c8);
      PassRunner::~PassRunner((PassRunner *)local_1c8);
      PassOptions::~PassOptions((PassOptions *)local_d0);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x203,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::(anonymous namespace)::TrivialOnceFunctionCollector>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::(anonymous namespace)::TrivialOnceFunctionCollector>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }